

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

instruction * dmrC_alloc_phisrc(dmr_C *C,pseudo_t pseudo,symbol *type)

{
  symbol *psVar1;
  pseudo_t ppVar2;
  undefined8 *ptr;
  
  psVar1 = (symbol *)alloc_typed_instruction(C,0x2f,type);
  ppVar2 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
  ppVar2->type = PSEUDO_PHI;
  dmrC_alloc_phisrc::nr = dmrC_alloc_phisrc::nr + 1;
  ppVar2->nr = dmrC_alloc_phisrc::nr;
  (ppVar2->field_5).sym = psVar1;
  (((anon_union_24_12_0e8c74c2_for_instruction_7 *)&psVar1->replace)->field_4).phi_src = pseudo;
  if (((pseudo != (pseudo_t)0x0) && (pseudo->type != PSEUDO_VOID)) && (pseudo->type != PSEUDO_VAL))
  {
    ptr = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
    ptr[1] = (anon_union_24_12_0e8c74c2_for_instruction_7 *)&psVar1->replace;
    *ptr = psVar1;
    ptrlist_add((ptr_list **)&pseudo->users,ptr,&C->ptrlist_allocator);
  }
  ((anon_union_8_2_14638a90_for_instruction_5 *)&psVar1->next_id)->target = ppVar2;
  return (instruction *)psVar1;
}

Assistant:

struct instruction *dmrC_alloc_phisrc(struct dmr_C *C, pseudo_t pseudo, struct symbol *type)
{
	struct instruction *insn = alloc_typed_instruction(C, OP_PHISOURCE, type);
	pseudo_t phi = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator, 0);
	static int nr = 0;

	phi->type = PSEUDO_PHI;
	phi->nr = ++nr;
	phi->def = insn;

	dmrC_use_pseudo(C, insn, pseudo, &insn->phi_src);
	insn->target = phi;
	return insn;
}